

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fl_utf8.cxx
# Opt level: O1

int fl_utf8len1(char c)

{
  int iVar1;
  
  iVar1 = 1;
  if (((((~c & 0xc0U) == 0) && (iVar1 = 2, (c & 0x20U) != 0)) && (iVar1 = 3, (c & 0x10U) != 0)) &&
     (iVar1 = 4, (c & 8U) != 0)) {
    iVar1 = 6 - (uint)((c & 4U) == 0);
  }
  return iVar1;
}

Assistant:

int fl_utf8len1(char c)
{
  if (!(c & 0x80)) return 1;
  if (c & 0x40) {
    if (c & 0x20) {
      if (c & 0x10) {
        if (c & 0x08) {
          if (c & 0x04) {
            return 6;
          }
          return 5;
        }
        return 4;
      }
      return 3;
    }
    return 2;
  }
  return 1;
}